

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *keys,int end,IdxCompare *compare,int start,bool type)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int32_t iVar13;
  fpclass_type fVar14;
  int32_t iVar15;
  bool bVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  uint end_00;
  uint uVar21;
  long lVar22;
  uint start_00;
  ulong uVar23;
  int *piVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  
  uVar23 = (ulong)(uint)start;
  if (start + 1 < end) {
    end_00 = end - 1;
    uVar17 = end_00 - start;
    if (0x18 < (int)uVar17) {
LAB_00302d4d:
      start_00 = (uint)uVar23;
      iVar18 = (uVar17 >> 1) + start_00;
      pNVar1 = keys + iVar18;
      iVar18 = keys[iVar18].idx;
      lVar19 = (long)(int)start_00;
      lVar20 = -(long)(int)end_00;
      uVar29 = uVar23;
      uVar17 = end_00;
LAB_00302da8:
      iVar27 = (int)uVar29;
      if ((type & 1U) != 0) {
        if (iVar27 < (int)end_00) {
          piVar24 = &keys[iVar27].idx;
          lVar22 = 0;
          do {
            bVar16 = EQ(*piVar24,iVar18);
            if ((bVar16) || (iVar18 <= *piVar24)) {
              uVar28 = iVar27 - (int)lVar22;
              break;
            }
            lVar22 = lVar22 + -1;
            piVar24 = piVar24 + 0xf;
            uVar28 = end_00;
          } while (iVar27 + lVar20 != lVar22);
          uVar29 = (ulong)uVar28;
        }
        if ((int)uVar17 <= (int)start_00) goto LAB_00302f02;
        uVar28 = (uint)uVar29;
        lVar22 = (long)(int)uVar17;
        piVar24 = &keys[lVar22].idx;
        do {
          bVar16 = EQ(*piVar24,iVar18);
          if ((!bVar16) && (*piVar24 < iVar18)) goto LAB_00302ef3;
          lVar22 = lVar22 + -1;
          piVar24 = piVar24 + -0xf;
          uVar17 = start_00;
        } while (lVar19 < lVar22);
        goto LAB_00302efb;
      }
      if (iVar27 < (int)end_00) {
        piVar24 = &keys[iVar27].idx;
        lVar22 = 0;
        do {
          bVar16 = EQ(*piVar24,iVar18);
          if ((!bVar16) && (iVar18 <= *piVar24)) {
            uVar28 = iVar27 - (int)lVar22;
            break;
          }
          lVar22 = lVar22 + -1;
          piVar24 = piVar24 + 0xf;
          uVar28 = end_00;
        } while (iVar27 + lVar20 != lVar22);
        uVar29 = (ulong)uVar28;
      }
      if ((int)start_00 < (int)uVar17) {
        uVar28 = (uint)uVar29;
        lVar22 = (long)(int)uVar17;
        piVar24 = &keys[lVar22].idx;
        do {
          bVar16 = EQ(*piVar24,iVar18);
          if ((bVar16) || (*piVar24 < iVar18)) goto LAB_00302ef3;
          lVar22 = lVar22 + -1;
          piVar24 = piVar24 + -0xf;
          uVar17 = start_00;
        } while (lVar19 < lVar22);
        goto LAB_00302efb;
      }
      goto LAB_00302f02;
    }
LAB_0030326f:
    if (0 < (int)uVar17) {
      SPxShellsort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                (keys,end_00,compare,start);
      return;
    }
  }
  return;
LAB_00302ef3:
  uVar17 = (uint)lVar22;
LAB_00302efb:
  uVar29 = (ulong)uVar28;
LAB_00302f02:
  iVar27 = (int)uVar29;
  if ((int)uVar17 <= iVar27) goto LAB_00302fd2;
  uVar5 = *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 8);
  uVar6 = *(undefined8 *)keys[iVar27].val.m_backend.data._M_elems;
  uVar7 = *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 2);
  puVar2 = keys[iVar27].val.m_backend.data._M_elems + 4;
  uVar8 = *(undefined8 *)puVar2;
  uVar9 = *(undefined8 *)(puVar2 + 2);
  iVar3 = keys[iVar27].val.m_backend.exp;
  bVar16 = keys[iVar27].val.m_backend.neg;
  iVar4 = keys[iVar27].idx;
  uVar10 = *(undefined8 *)(keys[(int)uVar17].val.m_backend.data._M_elems + 2);
  puVar2 = keys[(int)uVar17].val.m_backend.data._M_elems + 4;
  uVar11 = *(undefined8 *)puVar2;
  uVar12 = *(undefined8 *)(puVar2 + 2);
  *(undefined8 *)keys[iVar27].val.m_backend.data._M_elems =
       *(undefined8 *)keys[(int)uVar17].val.m_backend.data._M_elems;
  *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 2) = uVar10;
  puVar2 = keys[iVar27].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar11;
  *(undefined8 *)(puVar2 + 2) = uVar12;
  *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 8) =
       *(undefined8 *)(keys[(int)uVar17].val.m_backend.data._M_elems + 8);
  keys[iVar27].val.m_backend.exp = keys[(int)uVar17].val.m_backend.exp;
  keys[iVar27].val.m_backend.neg = keys[(int)uVar17].val.m_backend.neg;
  keys[iVar27].idx = keys[(int)uVar17].idx;
  *(undefined8 *)(keys[(int)uVar17].val.m_backend.data._M_elems + 8) = uVar5;
  puVar2 = keys[(int)uVar17].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar8;
  *(undefined8 *)(puVar2 + 2) = uVar9;
  *(undefined8 *)keys[(int)uVar17].val.m_backend.data._M_elems = uVar6;
  *(undefined8 *)(keys[(int)uVar17].val.m_backend.data._M_elems + 2) = uVar7;
  keys[(int)uVar17].val.m_backend.exp = iVar3;
  keys[(int)uVar17].val.m_backend.neg = bVar16;
  fVar14 = keys[iVar27].val.m_backend.fpclass;
  iVar15 = keys[iVar27].val.m_backend.prec_elem;
  iVar13 = keys[(int)uVar17].val.m_backend.prec_elem;
  keys[iVar27].val.m_backend.fpclass = keys[(int)uVar17].val.m_backend.fpclass;
  keys[iVar27].val.m_backend.prec_elem = iVar13;
  keys[(int)uVar17].val.m_backend.fpclass = fVar14;
  keys[(int)uVar17].val.m_backend.prec_elem = iVar15;
  keys[(int)uVar17].idx = iVar4;
  uVar29 = (ulong)(iVar27 + 1);
  uVar17 = uVar17 - 1;
  goto LAB_00302da8;
LAB_00302fd2:
  if ((type & 1U) == 0) {
    if ((int)start_00 < (int)uVar17) {
      uVar25 = (ulong)(int)uVar17;
      piVar24 = &keys[uVar25].idx;
      do {
        bVar16 = EQ(iVar18,*piVar24);
        if ((!bVar16) && (uVar26 = uVar25, *piVar24 <= iVar18)) break;
        uVar25 = uVar25 - 1;
        piVar24 = piVar24 + -0xf;
        uVar26 = uVar23;
      } while (lVar19 < (long)uVar25);
      uVar17 = (uint)uVar26;
    }
    if (uVar17 == end_00) {
      uVar5 = *(undefined8 *)(keys[(int)uVar17].val.m_backend.data._M_elems + 8);
      uVar6 = *(undefined8 *)keys[(int)uVar17].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[(int)uVar17].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar17].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      iVar18 = keys[(int)uVar17].val.m_backend.exp;
      bVar16 = keys[(int)uVar17].val.m_backend.neg;
      iVar27 = keys[(int)uVar17].idx;
      uVar10 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar11 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar12 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      *(undefined8 *)keys[(int)uVar17].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar17].val.m_backend.data._M_elems + 2) = uVar10;
      puVar2 = keys[(int)uVar17].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar11;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      *(undefined8 *)(keys[(int)uVar17].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      keys[(int)uVar17].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar17].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar17].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar6;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pNVar1->val).m_backend.exp = iVar18;
      (pNVar1->val).m_backend.neg = bVar16;
      fVar14 = keys[(int)uVar17].val.m_backend.fpclass;
      iVar15 = keys[(int)uVar17].val.m_backend.prec_elem;
      iVar13 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar17].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar17].val.m_backend.prec_elem = iVar13;
      (pNVar1->val).m_backend.fpclass = fVar14;
      (pNVar1->val).m_backend.prec_elem = iVar15;
      pNVar1->idx = iVar27;
      uVar17 = uVar17 - 1;
    }
  }
  else {
    if (iVar27 < (int)end_00) {
      piVar24 = &keys[iVar27].idx;
      lVar19 = 0;
      do {
        bVar16 = EQ(iVar18,*piVar24);
        if ((!bVar16) && (iVar18 < *piVar24)) {
          uVar28 = iVar27 - (int)lVar19;
          break;
        }
        lVar19 = lVar19 + -1;
        piVar24 = piVar24 + 0xf;
        uVar28 = end_00;
      } while ((long)iVar27 - (long)(int)end_00 != lVar19);
      uVar29 = (ulong)uVar28;
    }
    uVar28 = (uint)uVar29;
    if (uVar28 == start_00) {
      uVar5 = *(undefined8 *)(keys[(int)uVar28].val.m_backend.data._M_elems + 8);
      uVar6 = *(undefined8 *)keys[(int)uVar28].val.m_backend.data._M_elems;
      uVar7 = *(undefined8 *)(keys[(int)uVar28].val.m_backend.data._M_elems + 2);
      puVar2 = keys[(int)uVar28].val.m_backend.data._M_elems + 4;
      uVar8 = *(undefined8 *)puVar2;
      uVar9 = *(undefined8 *)(puVar2 + 2);
      iVar18 = keys[(int)uVar28].val.m_backend.exp;
      bVar16 = keys[(int)uVar28].val.m_backend.neg;
      iVar27 = keys[(int)uVar28].idx;
      uVar10 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2);
      uVar11 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4);
      uVar12 = *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6);
      *(undefined8 *)keys[(int)uVar28].val.m_backend.data._M_elems =
           *(undefined8 *)(pNVar1->val).m_backend.data._M_elems;
      *(undefined8 *)(keys[(int)uVar28].val.m_backend.data._M_elems + 2) = uVar10;
      puVar2 = keys[(int)uVar28].val.m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar11;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      *(undefined8 *)(keys[(int)uVar28].val.m_backend.data._M_elems + 8) =
           *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8);
      keys[(int)uVar28].val.m_backend.exp = (pNVar1->val).m_backend.exp;
      keys[(int)uVar28].val.m_backend.neg = (pNVar1->val).m_backend.neg;
      keys[(int)uVar28].idx = pNVar1->idx;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 8) = uVar5;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 4) = uVar8;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 6) = uVar9;
      *(undefined8 *)(pNVar1->val).m_backend.data._M_elems = uVar6;
      *(undefined8 *)((pNVar1->val).m_backend.data._M_elems + 2) = uVar7;
      (pNVar1->val).m_backend.exp = iVar18;
      (pNVar1->val).m_backend.neg = bVar16;
      fVar14 = keys[(int)uVar28].val.m_backend.fpclass;
      iVar15 = keys[(int)uVar28].val.m_backend.prec_elem;
      iVar13 = (pNVar1->val).m_backend.prec_elem;
      keys[(int)uVar28].val.m_backend.fpclass = (pNVar1->val).m_backend.fpclass;
      keys[(int)uVar28].val.m_backend.prec_elem = iVar13;
      (pNVar1->val).m_backend.fpclass = fVar14;
      (pNVar1->val).m_backend.prec_elem = iVar15;
      pNVar1->idx = iVar27;
      uVar29 = (ulong)(uVar28 + 1);
    }
  }
  uVar28 = (uint)uVar29;
  if ((int)(end_00 - uVar28) < (int)(uVar17 - start_00)) {
    uVar29 = uVar23;
    uVar21 = uVar17;
    uVar17 = end_00;
    start_00 = uVar28;
    if ((int)end_00 <= (int)uVar28) goto LAB_00303255;
  }
  else {
    uVar23 = uVar29;
    uVar21 = end_00;
    if ((int)uVar17 <= (int)start_00) goto LAB_00303255;
  }
  SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
            (keys,uVar17 + 1,compare,start_00,(bool)(~type & 1));
  uVar23 = uVar29;
LAB_00303255:
  end_00 = uVar21;
  type = (bool)(type ^ 1);
  start = (int)uVar23;
  uVar17 = end_00 - start;
  if ((int)uVar17 < 0x19) goto LAB_0030326f;
  goto LAB_00302d4d;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}